

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int archive_write_v7tar_options(archive_write *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int ret;
  v7tar *v7tar;
  char *charset;
  wchar_t local_4;
  
  charset = *(char **)&in_RDI[1].current_codepage;
  local_4 = L'\xffffffe7';
  iVar1 = strcmp(in_RSI,"hdrcharset");
  if (iVar1 == 0) {
    if ((in_RDX == (archive *)0x0) || ((char)in_RDX->magic == '\0')) {
      archive_set_error(in_RDI,-1,"%s: hdrcharset option needs a character-set name",in_RDI[1].sconv
                       );
    }
    else {
      paVar2 = archive_string_conversion_to_charset(in_RDX,charset,local_4);
      *(archive_string_conv **)(charset + 0x10) = paVar2;
      if (*(long *)(charset + 0x10) == 0) {
        local_4 = L'\xffffffe2';
      }
      else {
        local_4 = L'\0';
      }
    }
  }
  else {
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
archive_write_v7tar_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct v7tar *v7tar = (struct v7tar *)a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: hdrcharset option needs a character-set name",
			    a->format_name);
		else {
			v7tar->opt_sconv = archive_string_conversion_to_charset(
			    &a->archive, val, 0);
			if (v7tar->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}